

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_node.cpp
# Opt level: O1

bool __thiscall duckdb::SelectNode::Equals(SelectNode *this,QueryNode *other_p)

{
  bool bVar1;
  SelectNode *pSVar2;
  
  bVar1 = QueryNode::Equals(&this->super_QueryNode,other_p);
  if (bVar1) {
    if (this == (SelectNode *)other_p) {
      return true;
    }
    pSVar2 = QueryNode::Cast<duckdb::SelectNode>(other_p);
    bVar1 = ExpressionUtil::ListEquals(&this->select_list,&pSVar2->select_list);
    if ((((bVar1) && (bVar1 = TableRef::Equals(&this->from_table,&pSVar2->from_table), bVar1)) &&
        (bVar1 = ParsedExpression::Equals(&this->where_clause,&pSVar2->where_clause), bVar1)) &&
       (((bVar1 = ParsedExpression::ListEquals
                            (&(this->groups).group_expressions,&(pSVar2->groups).group_expressions),
         bVar1 && (bVar1 = ::std::operator!=(&(this->groups).grouping_sets.
                                              super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                             ,&(pSVar2->groups).grouping_sets.
                                               super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                            ), !bVar1)) &&
        ((bVar1 = SampleOptions::Equals
                            ((this->sample).
                             super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                             .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl,
                             (pSVar2->sample).
                             super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                             .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl),
         bVar1 && (bVar1 = ParsedExpression::Equals(&this->having,&pSVar2->having), bVar1)))))) {
      bVar1 = ParsedExpression::Equals(&this->qualify,&pSVar2->qualify);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool SelectNode::Equals(const QueryNode *other_p) const {
	if (!QueryNode::Equals(other_p)) {
		return false;
	}
	if (this == other_p) {
		return true;
	}
	auto &other = other_p->Cast<SelectNode>();

	// SELECT
	if (!ExpressionUtil::ListEquals(select_list, other.select_list)) {
		return false;
	}
	// FROM
	if (!TableRef::Equals(from_table, other.from_table)) {
		return false;
	}
	// WHERE
	if (!ParsedExpression::Equals(where_clause, other.where_clause)) {
		return false;
	}
	// GROUP BY
	if (!ParsedExpression::ListEquals(groups.group_expressions, other.groups.group_expressions)) {
		return false;
	}
	if (groups.grouping_sets != other.groups.grouping_sets) {
		return false;
	}
	if (!SampleOptions::Equals(sample.get(), other.sample.get())) {
		return false;
	}
	// HAVING
	if (!ParsedExpression::Equals(having, other.having)) {
		return false;
	}
	// QUALIFY
	if (!ParsedExpression::Equals(qualify, other.qualify)) {
		return false;
	}
	return true;
}